

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkHin(ARKodeMem ark_mem,sunrealtype tout)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  sunrealtype sVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  sunrealtype yddnrm;
  ulong local_38;
  undefined8 uStack_30;
  
  dVar10 = tout - ark_mem->tcur;
  iVar1 = -0x1b;
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    dVar11 = ABS(ark_mem->tcur);
    if (dVar11 <= ABS(tout)) {
      dVar11 = ABS(tout);
    }
    dVar11 = dVar11 * ark_mem->uround;
    if (dVar11 + dVar11 <= ABS(dVar10)) {
      if (ark_mem->fn_is_current == 0) {
        iVar1 = (*ark_mem->step_fullrhs)(ark_mem,ark_mem->tn,ark_mem->yn,ark_mem->fn,0);
        if (iVar1 != 0) {
          return -8;
        }
        ark_mem->fn_is_current = 1;
      }
      dVar11 = dVar11 * 100.0;
      sVar5 = arkUpperBoundH0(ark_mem,ABS(dVar10));
      dVar7 = dVar11 * sVar5;
      dVar6 = 0.0;
      if (0.0 < dVar7) {
        if (dVar7 < 0.0) {
          dVar6 = sqrt(dVar7);
        }
        else {
          dVar6 = SQRT(dVar7);
        }
      }
      if (dVar11 <= sVar5) {
        local_38 = -(ulong)(dVar10 <= 0.0);
        uStack_30 = 0;
        uVar3 = 1;
        do {
          dVar7 = dVar6;
          iVar1 = arkYddNorm(ark_mem,(sunrealtype)
                                     (~local_38 & (ulong)dVar7 | (ulong)-dVar7 & local_38),&yddnrm);
          if (iVar1 < 0) {
            return -8;
          }
          if (sVar5 * yddnrm * sVar5 <= 2.0) {
            dVar8 = sVar5 * dVar7;
          }
          else {
            dVar8 = 2.0 / yddnrm;
          }
          dVar6 = 0.0;
          if (0.0 < dVar8) {
            if (dVar8 < 0.0) {
              dVar6 = sqrt(dVar8);
            }
            else {
              dVar6 = SQRT(dVar8);
            }
          }
          dVar8 = dVar6;
        } while (((uVar3 != 4) && ((dVar9 = dVar6 / dVar7, dVar9 <= 0.5 || (2.0 <= dVar9)))) &&
                ((uVar2 = uVar3 + 1, bVar4 = uVar3 < 2, uVar3 = uVar2, bVar4 ||
                 (dVar8 = dVar7, dVar9 <= 2.0))));
        if (dVar11 <= dVar8 * 0.5) {
          dVar11 = dVar8 * 0.5;
        }
        if (dVar11 <= sVar5) {
          sVar5 = dVar11;
        }
        dVar6 = (double)(-(ulong)(dVar10 <= 0.0) & (ulong)-sVar5 |
                        ~-(ulong)(dVar10 <= 0.0) & (ulong)sVar5);
      }
      else if (dVar10 <= 0.0) {
        dVar6 = -dVar6;
      }
      ark_mem->h = dVar6;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int arkHin(ARKodeMem ark_mem, sunrealtype tout)
{
  int retval, sign, count1, count2;
  sunrealtype tdiff, tdist, tround, hlb, hub;
  sunrealtype hg, hgs, hs, hnew, hrat, h0, yddnrm;
  sunbooleantype hgOK;

  /* If tout is too close to tn, give up */
  if ((tdiff = tout - ark_mem->tcur) == ZERO) { return (ARK_TOO_CLOSE); }

  sign   = (tdiff > ZERO) ? 1 : -1;
  tdist  = SUNRabs(tdiff);
  tround = ark_mem->uround * SUNMAX(SUNRabs(ark_mem->tcur), SUNRabs(tout));

  if (tdist < TWO * tround) { return (ARK_TOO_CLOSE); }

  /* call full RHS if needed */
  if (!(ark_mem->fn_is_current))
  {
    /* NOTE: The step size (h) is used in setting the tolerance in a potential
       mass matrix solve when computing the full RHS. Before calling arkHin, h
       is set to |tout - tcur| or 1 and so we do not need to guard against
       h == 0 here before calling the full RHS. */
    retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tn, ark_mem->yn,
                                   ark_mem->fn, ARK_FULLRHS_START);
    if (retval) { return ARK_RHSFUNC_FAIL; }
    ark_mem->fn_is_current = SUNTRUE;
  }

  /* Set lower and upper bounds on h0, and take geometric mean
     as first trial value.
     Exit with this value if the bounds cross each other. */
  hlb = H0_LBFACTOR * tround;
  hub = arkUpperBoundH0(ark_mem, tdist);

  hg = SUNRsqrt(hlb * hub);

  if (hub < hlb)
  {
    if (sign == -1) { ark_mem->h = -hg; }
    else { ark_mem->h = hg; }
    return (ARK_SUCCESS);
  }

  /* Outer loop */
  hs = hg; /* safeguard against 'uninitialized variable' warning */
  for (count1 = 1; count1 <= H0_ITERS; count1++)
  {
    /* Attempts to estimate ydd */
    hgOK = SUNFALSE;

    for (count2 = 1; count2 <= H0_ITERS; count2++)
    {
      hgs    = hg * sign;
      retval = arkYddNorm(ark_mem, hgs, &yddnrm);
      /* If f() failed unrecoverably, give up */
      if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
      /* If successful, we can use ydd */
      if (retval == ARK_SUCCESS)
      {
        hgOK = SUNTRUE;
        break;
      }
      /* f() failed recoverably; cut step size and test it again */
      hg *= SUN_RCONST(0.2);
    }

    /* If f() failed recoverably H0_ITERS times */
    if (!hgOK)
    {
      /* Exit if this is the first or second pass. No recovery possible */
      if (count1 <= 2) { return (ARK_REPTD_RHSFUNC_ERR); }
      /* We have a fall-back option. The value hs is a previous hnew which
         passed through f(). Use it and break */
      hnew = hs;
      break;
    }

    /* The proposed step size is feasible. Save it. */
    hs = hg;

    /* Propose new step size */
    hnew = (yddnrm * hub * hub > TWO) ? SUNRsqrt(TWO / yddnrm)
                                      : SUNRsqrt(hg * hub);

    /* If last pass, stop now with hnew */
    if (count1 == H0_ITERS) { break; }

    hrat = hnew / hg;

    /* Accept hnew if it does not differ from hg by more than a factor of 2 */
    if ((hrat > HALF) && (hrat < TWO)) { break; }

    /* After one pass, if ydd seems to be bad, use fall-back value. */
    if ((count1 > 1) && (hrat > TWO))
    {
      hnew = hg;
      break;
    }

    /* Send this value back through f() */
    hg = hnew;
  }

  /* Apply bounds, bias factor, and attach sign */
  h0 = H0_BIAS * hnew;
  if (h0 < hlb) { h0 = hlb; }
  if (h0 > hub) { h0 = hub; }
  if (sign == -1) { h0 = -h0; }
  ark_mem->h = h0;

  return (ARK_SUCCESS);
}